

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAdapter::makeOxygenFuncfl
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType drho,RealType nrho,
          vector<double,_std::allocator<double>_> *F)

{
  AtomType *pAVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  RealType local_258;
  RealType local_250;
  RealType local_248;
  RealType local_240;
  RealType local_238;
  RealType local_230;
  shared_ptr<OpenMD::GenericData> local_228;
  shared_ptr<OpenMD::GenericData> local_218;
  shared_ptr<OpenMD::GenericData> local_208;
  undefined4 local_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  RealType local_1c8;
  FuncflParameters local_1c0;
  ZhouParameters local_140;
  
  local_278.field_2._M_allocated_capacity = (size_type)re;
  local_278.field_2._8_8_ = fe;
  local_258 = alpha;
  local_250 = beta;
  local_248 = A;
  local_240 = B;
  local_238 = kappa;
  local_230 = lambda;
  bVar2 = isEAM(this);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)ZhouTypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)FuncflTypeID_abi_cxx11_);
  }
  local_1e8 = local_1d8;
  local_1e0 = 0;
  local_1c0.atomicNumber = 0;
  local_1c0.atomicMass = 0.0;
  local_1c0.nrho = 0;
  local_1c0.drho = 0.0;
  local_1c0.nr = 0;
  local_1d8[0] = 0;
  local_1c0.dr = 0.0;
  local_1c0.rcut = 0.0;
  local_1c0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  memset(&local_140.rhoe,0,0x100);
  local_1f0 = 6;
  local_1c8 = (RealType)local_278.field_2._M_allocated_capacity;
  local_140.re = (RealType)local_278.field_2._M_allocated_capacity;
  local_140.fe = (RealType)local_278.field_2._8_8_;
  local_140.alpha = local_258;
  local_140.beta = local_250;
  local_140.A = local_248;
  local_140.B = local_240;
  local_140.kappa = local_238;
  local_140.lambda = local_230;
  std::vector<double,_std::allocator<double>_>::operator=(&local_1c0.F,F);
  local_1c0.drho = drho;
  local_1c0.nrho = (int)nrho;
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&local_278,(EAMParameters *)EAMtypeID_abi_cxx11_);
  local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278._M_dataplus._M_p;
  local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&local_278,(ZhouParameters *)ZhouTypeID_abi_cxx11_);
  local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278._M_dataplus._M_p;
  local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (&local_278,(FuncflParameters *)FuncflTypeID_abi_cxx11_);
  local_228.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278._M_dataplus._M_p;
  local_228.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length);
  ZhouParameters::~ZhouParameters(&local_140);
  FuncflParameters::~FuncflParameters(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void EAMAdapter::makeOxygenFuncfl(RealType re, RealType fe, RealType alpha,
                                    RealType beta, RealType A, RealType B,
                                    RealType kappa, RealType lambda,
                                    RealType drho, RealType nrho,
                                    std::vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamOxygenFuncfl;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;

    funcflParam.F    = F;
    funcflParam.drho = drho;
    funcflParam.nrho = nrho;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }